

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double uniform_discrete_cdf(int x,int a,int b)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (a <= x) {
    if (b < x) {
      return 1.0;
    }
    dVar1 = (double)((x - a) + 1) / (double)((b - a) + 1);
  }
  return dVar1;
}

Assistant:

double uniform_discrete_cdf ( int x, int a, int b )

//****************************************************************************80
//
//  Purpose:
//
//    UNIFORM_DISCRETE_CDF evaluates the Uniform Discrete CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the argument of the CDF.
//
//    Input, int A, B, the parameters of the PDF.
//    A <= B.
//
//    Output, double UNIFORM_DISCRETE_CDF, the value of the CDF.
//
{
  double cdf;

  if ( x < a )
  {
    cdf = 0.0;
  }
  else if ( b < x )
  {
    cdf = 1.0;
  }
  else
  {
    cdf = static_cast<double>(x + 1 - a ) / static_cast<double>(b + 1 - a );
  }

  return cdf;
}